

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdasher.cpp
# Opt level: O0

void __thiscall VDasher::moveTo(VDasher *this,VPointF *p)

{
  bool bVar1;
  long *in_RSI;
  long *in_RDI;
  double dVar2;
  size_t i_1;
  float normalizeLen;
  size_t i;
  float totalLength;
  VDasher *in_stack_ffffffffffffffd0;
  float local_24;
  ulong local_20;
  float local_14;
  
  *(undefined1 *)(in_RDI + 6) = 0;
  *(undefined1 *)((long)in_RDI + 0x31) = 1;
  in_RDI[2] = *in_RSI;
  in_RDI[3] = 0;
  bVar1 = vCompare(0.0,1.565306e-39);
  if (bVar1) {
    *(undefined4 *)(in_RDI + 4) = *(undefined4 *)(*in_RDI + in_RDI[3] * 8);
  }
  else {
    local_14 = 0.0;
    for (local_20 = 0; local_20 < (ulong)in_RDI[1]; local_20 = local_20 + 1) {
      local_14 = *(float *)(*in_RDI + local_20 * 8) + *(float *)(*in_RDI + 4 + local_20 * 8);
    }
    dVar2 = std::fmod((double)(ulong)*(uint *)((long)in_RDI + 0x24),(double)(ulong)(uint)local_14);
    local_24 = SUB84(dVar2,0);
    if (local_24 < 0.0) {
      local_24 = local_14 + local_24;
    }
    for (in_stack_ffffffffffffffd0 = (VDasher *)0x0;
        in_stack_ffffffffffffffd0 < (VDasher *)in_RDI[1];
        in_stack_ffffffffffffffd0 = (VDasher *)((long)&in_stack_ffffffffffffffd0->mDashArray + 1)) {
      if (local_24 < *(float *)(*in_RDI + (long)in_stack_ffffffffffffffd0 * 8)) {
        in_RDI[3] = (long)in_stack_ffffffffffffffd0;
        *(float *)(in_RDI + 4) =
             *(float *)(*in_RDI + (long)in_stack_ffffffffffffffd0 * 8) - local_24;
        *(undefined1 *)(in_RDI + 6) = 0;
        break;
      }
      local_24 = local_24 - *(float *)(*in_RDI + (long)in_stack_ffffffffffffffd0 * 8);
      if (local_24 < *(float *)(*in_RDI + 4 + (long)in_stack_ffffffffffffffd0 * 8)) {
        in_RDI[3] = (long)in_stack_ffffffffffffffd0;
        *(float *)(in_RDI + 4) =
             *(float *)(*in_RDI + 4 + (long)in_stack_ffffffffffffffd0 * 8) - local_24;
        *(undefined1 *)(in_RDI + 6) = 1;
        break;
      }
      local_24 = local_24 - *(float *)(*in_RDI + 4 + (long)in_stack_ffffffffffffffd0 * 8);
    }
  }
  bVar1 = vIsZero(0.0);
  if (bVar1) {
    updateActiveSegment(in_stack_ffffffffffffffd0);
  }
  return;
}

Assistant:

void VDasher::moveTo(const VPointF &p)
{
    mDiscard = false;
    mStartNewSegment = true;
    mCurPt = p;
    mIndex = 0;

    if (!vCompare(mDashOffset, 0.0f)) {
        float totalLength = 0.0;
        for (size_t i = 0; i < mArraySize; i++) {
            totalLength = mDashArray[i].length + mDashArray[i].gap;
        }
        float normalizeLen = std::fmod(mDashOffset, totalLength);
        if (normalizeLen < 0.0f) {
            normalizeLen = totalLength + normalizeLen;
        }
        // now the length is less than total length and +ve
        // findout the current dash index , dashlength and gap.
        for (size_t i = 0; i < mArraySize; i++) {
            if (normalizeLen < mDashArray[i].length) {
                mIndex = i;
                mCurrentLength = mDashArray[i].length - normalizeLen;
                mDiscard = false;
                break;
            }
            normalizeLen -= mDashArray[i].length;
            if (normalizeLen < mDashArray[i].gap) {
                mIndex = i;
                mCurrentLength = mDashArray[i].gap - normalizeLen;
                mDiscard = true;
                break;
            }
            normalizeLen -= mDashArray[i].gap;
        }
    } else {
        mCurrentLength = mDashArray[mIndex].length;
    }
    if (vIsZero(mCurrentLength)) updateActiveSegment();
}